

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O0

void __thiscall
kratos::Property::edge(Property *this,EventEdgeType type,shared_ptr<kratos::Var> *var)

{
  initializer_list<const_kratos::IRNode_*> __l;
  EventEdgeType edge;
  int iVar1;
  element_type *peVar2;
  VarException *this_00;
  EventControl local_b0;
  undefined1 local_8a;
  allocator<const_kratos::IRNode_*> local_89;
  element_type *local_88;
  element_type **local_80;
  size_type local_78;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_70;
  allocator<char> local_41;
  string local_40;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *local_20;
  shared_ptr<kratos::Var> *var_local;
  Property *pPStack_10;
  EventEdgeType type_local;
  Property *this_local;
  
  local_20 = &var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
  var_local._4_4_ = type;
  pPStack_10 = this;
  peVar2 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      var);
  iVar1 = (*(peVar2->super_IRNode)._vptr_IRNode[7])();
  edge = var_local._4_4_;
  if (iVar1 != 1) {
    local_8a = 1;
    this_00 = (VarException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"{0} should be width 1",&local_41);
    local_88 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(local_20);
    local_80 = &local_88;
    local_78 = 1;
    std::allocator<const_kratos::IRNode_*>::allocator(&local_89);
    __l._M_len = local_78;
    __l._M_array = (iterator)local_80;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_70,__l,&local_89);
    VarException::VarException(this_00,&local_40,&local_70);
    local_8a = 0;
    __cxa_throw(this_00,&VarException::typeinfo,VarException::~VarException);
  }
  peVar2 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     local_20);
  EventControl::EventControl(&local_b0,edge,peVar2);
  (this->edge_).delay = local_b0.delay;
  (this->edge_).var = local_b0.var;
  (this->edge_).type = local_b0.type;
  (this->edge_).edge = local_b0.edge;
  (this->edge_).delay_side = local_b0.delay_side;
  return;
}

Assistant:

void Property::edge(kratos::EventEdgeType type, const std::shared_ptr<Var> &var) {
    if (var->width() != 1) throw VarException("{0} should be width 1", {var.get()});
    edge_ = EventControl(type, *var);
}